

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O0

ctmbstr prvTidytmbsubstr(ctmbstr s1,ctmbstr s2)

{
  uint uVar1;
  uint n;
  int iVar2;
  int local_2c;
  int diff;
  int ix;
  uint len2;
  uint len1;
  ctmbstr s2_local;
  ctmbstr s1_local;
  
  uVar1 = prvTidytmbstrlen(s1);
  n = prvTidytmbstrlen(s2);
  local_2c = 0;
  while( true ) {
    if ((int)(uVar1 - n) < local_2c) {
      return (ctmbstr)0x0;
    }
    iVar2 = prvTidytmbstrncasecmp(s1 + local_2c,s2,n);
    if (iVar2 == 0) break;
    local_2c = local_2c + 1;
  }
  return s1 + local_2c;
}

Assistant:

ctmbstr TY_(tmbsubstr)( ctmbstr s1, ctmbstr s2 )
{
    uint len1 = TY_(tmbstrlen)(s1), len2 = TY_(tmbstrlen)(s2);
    int ix, diff = len1 - len2;

    for ( ix = 0; ix <= diff; ++ix )
    {
        if ( TY_(tmbstrncasecmp)(s1+ix, s2, len2) == 0 )
            return (ctmbstr) s1+ix;
    }
    return NULL;
}